

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::Delaunay3dThread::StellateConflictStack::push
          (StellateConflictStack *this,index_t t1,index_t t1fbord,index_t t1fprev)

{
  pointer pFVar1;
  
  std::
  vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  ::resize(&this->store_,
           ((long)(this->store_).
                  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->store_).
                 super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc + 1);
  pFVar1 = (this->store_).
           super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar1[-1].t1 = t1;
  pFVar1[-1].t1fbord = (uint8)t1fbord;
  pFVar1[-1].t1fprev = (uint8)t1fprev;
  return;
}

Assistant:

void push(index_t t1, index_t t1fbord, index_t t1fprev) {
                store_.resize(store_.size()+1);
                top().t1 = t1;
                top().t1fbord = Numeric::uint8(t1fbord);
                top().t1fprev = Numeric::uint8(t1fprev);
            }